

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

void __thiscall moira::Moira::fullPrefetch<4ul,0>(Moira *this)

{
  bool bVar1;
  u32 uVar2;
  Moira *in_RDI;
  AEStackFrame frame;
  u32 in_stack_ffffffffffffffdc;
  undefined1 in_stack_ffffffffffffffe8 [16];
  undefined1 auVar3 [12];
  
  auVar3 = in_stack_ffffffffffffffe8._4_12_;
  bVar1 = misaligned<(moira::Size)2>(in_RDI,(in_RDI->reg).pc);
  if (bVar1) {
    frame = makeFrame<0ul>(auVar3._4_8_,auVar3._0_4_);
    execAddressError(in_RDI,frame,in_stack_ffffffffffffffdc);
  }
  else {
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(in_RDI,in_stack_ffffffffffffffdc);
    (in_RDI->queue).irc = (u16)uVar2;
    prefetch<4ul>(in_RDI);
  }
  return;
}

Assistant:

void
Moira::fullPrefetch()
{    
    // Check for address error
    if (misaligned(reg.pc)) {
        execAddressError(makeFrame(reg.pc), 2);
        return;
    }

    queue.irc = readM<MEM_PROG, Word>(reg.pc);
    if (delay) sync(delay);
    prefetch<F>();
}